

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDPSolver.cpp
# Opt level: O1

void __thiscall MDPSolver::LoadQTable(MDPSolver *this,string *filename,QTable *Q)

{
  size_t nrRows;
  size_t nrColumns;
  
  nrRows = PlanningUnitMADPDiscrete::GetNrStates(&this->_m_pu->super_PlanningUnitMADPDiscrete);
  nrColumns = (**(code **)((long)*(this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
  QTable::Load(filename,nrRows,nrColumns,Q);
  return;
}

Assistant:

void MDPSolver::LoadQTable(const string &filename,
                           QTable &Q)
{
    QTable::Load(filename,
                 GetPU()->GetNrStates(),
                 GetPU()->GetNrJointActions(),
                 Q);
}